

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O0

void fdb_rollback_stale_blocks(fdb_kvs_handle *handle,filemgr_header_revnum_t cur_revnum)

{
  avl_node *paVar1;
  list_elem *plVar2;
  ulong in_RSI;
  long in_RDI;
  stale_info_entry *entry;
  stale_info_commit query;
  stale_info_commit *commit;
  list_elem *elem;
  avl_node *avl;
  filemgr_header_revnum_t _revnum;
  filemgr_header_revnum_t i;
  btree_result br;
  btreeblk_handle *in_stack_ffffffffffffff98;
  avl_node *in_stack_ffffffffffffffa0;
  avl_tree *tree;
  avl_node *in_stack_ffffffffffffffb8;
  list_elem *local_38;
  avl_node *local_30;
  ulong local_28;
  ulong local_20;
  btree_result local_14;
  ulong local_10;
  long local_8;
  
  if (*(long *)(in_RDI + 0x188) != 0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (local_20 = *(ulong *)(in_RDI + 0x188); local_20 < local_10; local_20 = local_20 + 1) {
      local_28 = local_20 >> 0x38 | (local_20 & 0xff000000000000) >> 0x28 |
                 (local_20 & 0xff0000000000) >> 0x18 | (local_20 & 0xff00000000) >> 8 |
                 (local_20 & 0xff000000) << 8 | (local_20 & 0xff0000) << 0x18 |
                 (local_20 & 0xff00) << 0x28 | local_20 << 0x38;
      local_14 = btree_remove(*(btree **)(local_8 + 0x38),&local_28);
      btreeblk_end(in_stack_ffffffffffffff98);
    }
    tree = *(avl_tree **)(local_8 + 0x188);
    local_30 = avl_search(tree,in_stack_ffffffffffffffa0,(avl_cmp_func *)in_stack_ffffffffffffff98);
    if (local_30 == (avl_node *)0x0) {
      local_30 = avl_search_greater(tree,in_stack_ffffffffffffffa0,
                                    (avl_cmp_func *)in_stack_ffffffffffffff98);
    }
    while (local_30 != (avl_node *)0x0) {
      paVar1 = avl_next(local_30);
      avl_remove((avl_tree *)local_30,in_stack_ffffffffffffffb8);
      local_38 = list_begin((list *)&local_30[1].left);
      while (local_38 != (list_elem *)0x0) {
        plVar2 = list_remove((list *)&local_30[1].left,local_38);
        free(local_38[1].prev);
        free(local_38);
        local_38 = plVar2;
      }
      free(local_30);
      local_30 = paVar1;
    }
  }
  return;
}

Assistant:

void fdb_rollback_stale_blocks(fdb_kvs_handle *handle,
                               filemgr_header_revnum_t cur_revnum)
{
    btree_result br;
    filemgr_header_revnum_t i, _revnum;
    struct avl_node *avl;
    struct list_elem *elem;
    struct stale_info_commit *commit, query;
    struct stale_info_entry *entry;

    if (handle->rollback_revnum == 0) {
        return;
    }

    // remove from on-disk stale-tree
    for (i = handle->rollback_revnum; i < cur_revnum; ++i) {
        _revnum = _endian_encode(i);
        br = btree_remove(handle->staletree, (void*)&_revnum);
        // don't care the result
        (void)br;
        btreeblk_end(handle->bhandle);
    }

    // also remove from in-memory stale-tree
    query.revnum = handle->rollback_revnum;
    avl = avl_search(&handle->file->stale_info_tree,
                   &query.avl, _inmem_stale_cmp);
    if (!avl) {
        avl = avl_search_greater(&handle->file->stale_info_tree,
                               &query.avl, _inmem_stale_cmp);
    }
    while (avl) {
        commit = _get_entry(avl, struct stale_info_commit, avl);
        avl = avl_next(avl);

        avl_remove(&handle->file->stale_info_tree, &commit->avl);

        elem = list_begin(&commit->doc_list);
        while (elem) {
            entry = _get_entry(elem, struct stale_info_entry, le);
            elem = list_remove(&commit->doc_list, &entry->le);

            free(entry->ctx);
            free(entry);
        }

        free(commit);
    }
}